

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dsp_helper.c
# Opt level: O0

uint16_t mipsdsp_mul_u8_u16(uint8_t a,uint16_t b,CPUMIPSState_conflict5 *env)

{
  undefined4 local_1c;
  uint32_t tempI;
  CPUMIPSState_conflict5 *env_local;
  uint16_t b_local;
  uint8_t a_local;
  
  local_1c = (uint)a * (uint)b;
  if (0xffff < local_1c) {
    local_1c = 0xffff;
    set_DSPControl_overflow_flag(1,0x15,env);
  }
  return (uint16_t)local_1c;
}

Assistant:

static inline uint16_t mipsdsp_mul_u8_u16(uint8_t a, uint16_t b,
                                          CPUMIPSState *env)
{
    uint32_t tempI;

    tempI = (uint32_t)a * (uint32_t)b;
    if (tempI > 0x0000FFFF) {
        tempI = 0x0000FFFF;
        set_DSPControl_overflow_flag(1, 21, env);
    }

    return tempI & 0x0000FFFF;
}